

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxpool.h
# Opt level: O0

void __thiscall cxxpool::thread_pool::thread_pool(thread_pool *this,size_t n_threads)

{
  size_type sVar1;
  id iVar2;
  thread_pool *local_60;
  code *local_58;
  undefined8 local_50;
  thread local_48;
  thread local_40;
  thread thread;
  size_t n_target;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> thread_lock;
  size_t n_threads_local;
  thread_pool *this_local;
  
  thread_lock._M_device = (mutex_type *)n_threads;
  thread_pool(this);
  if (thread_lock._M_device != (mutex_type *)0x0) {
    std::lock_guard<std::mutex>::lock_guard(&local_20,&this->thread_mutex_);
    sVar1 = std::vector<std::thread,_std::allocator<std::thread>_>::size(&this->threads_);
    thread._M_id._M_thread =
         (id)((long)&((thread_lock._M_device)->super___mutex_base)._M_mutex + sVar1);
    while( true ) {
      iVar2._M_thread =
           std::vector<std::thread,_std::allocator<std::thread>_>::size(&this->threads_);
      if ((ulong)thread._M_id._M_thread <= iVar2._M_thread) break;
      std::thread::thread(&local_40);
      local_58 = worker;
      local_50 = 0;
      local_60 = this;
      std::thread::thread<void(cxxpool::thread_pool::*)(),cxxpool::thread_pool*,void>
                (&local_48,(type *)&local_58,&local_60);
      std::thread::operator=(&local_40,&local_48);
      std::thread::~thread(&local_48);
      std::vector<std::thread,_std::allocator<std::thread>_>::push_back(&this->threads_,&local_40);
      std::thread::~thread(&local_40);
    }
    std::lock_guard<std::mutex>::~lock_guard(&local_20);
  }
  return;
}

Assistant:

explicit thread_pool(std::size_t n_threads)
    : thread_pool{}
    {
        if (n_threads > 0) {
            std::lock_guard<std::mutex> thread_lock(thread_mutex_);
            const auto n_target = threads_.size() + n_threads;
            while (threads_.size() < n_target) {
                std::thread thread;
                try {
                    thread = std::thread{&thread_pool::worker, this};
                } catch (...) {
                    shutdown();
                    throw;
                }
                try {
                    threads_.push_back(std::move(thread));
                } catch (...) {
                    shutdown();
                    thread.join();
                    throw;
                }
            }
        }
    }